

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

char ** apprun_env_item_list_to_envp(apprun_env_item_list_t *list)

{
  uint uVar1;
  char **ppcVar2;
  char *pcVar3;
  apprun_env_item_list_t *ppaVar4;
  apprun_env_item_t *item;
  apprun_env_item_list_t paVar5;
  ulong uVar6;
  
  uVar1 = apprun_env_item_list_to_envp_len(list);
  ppcVar2 = (char **)calloc((ulong)(uVar1 + 1),8);
  paVar5 = *list;
  if (paVar5 != (apprun_env_item_list_t)0x0) {
    ppaVar4 = list + 1;
    uVar6 = 0;
    do {
      if (paVar5->current_value != (char *)0x0) {
        pcVar3 = apprun_env_envp_entry_create((char *)0x0,paVar5->name,paVar5->current_value);
        ppcVar2[uVar6] = pcVar3;
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      if (paVar5->original_value != (char *)0x0) {
        pcVar3 = apprun_env_envp_entry_create
                           ("APPRUN_ORIGINAL_",paVar5->name,paVar5->original_value);
        ppcVar2[uVar6] = pcVar3;
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      if (paVar5->startup_value != (char *)0x0) {
        pcVar3 = apprun_env_envp_entry_create("APPRUN_STARTUP_",paVar5->name,paVar5->startup_value);
        ppcVar2[uVar6] = pcVar3;
        uVar6 = (ulong)((int)uVar6 + 1);
      }
      paVar5 = *ppaVar4;
      ppaVar4 = ppaVar4 + 1;
    } while (paVar5 != (apprun_env_item_list_t)0x0);
  }
  return ppcVar2;
}

Assistant:

char **apprun_env_item_list_to_envp(apprun_env_item_list_t *list) {
    unsigned int envp_len = apprun_env_item_list_to_envp_len(list);

    // Allocate an extra space for NULL termination
    char **envp = calloc(envp_len + 1, sizeof(char *));
    unsigned count = 0;

    for (apprun_env_item_list_t *itr = list; *itr != NULL; itr++) {
        apprun_env_item_t *item = *itr;
        if (item->current_value != NULL) {
            char *env_entry = apprun_env_envp_entry_create(NULL, item->name, item->current_value);
            envp[count] = env_entry;
            count++;
        }

        if (item->original_value != NULL) {
            char *env_entry = apprun_env_envp_entry_create(APPRUN_ENV_ORIG_PREFIX, item->name,
                                                           item->original_value);
            envp[count] = env_entry;
            count++;
        }

        if (item->startup_value != NULL) {
            char *env_entry = apprun_env_envp_entry_create(APPRUN_ENV_STARTUP_PREFIX, item->name,
                                                           item->startup_value);
            envp[count] = env_entry;
            count++;
        }
    }

    return envp;
}